

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int TextCopy(char *dst,char *src)

{
  int local_1c;
  char *pcStack_18;
  int bytes;
  char *src_local;
  char *dst_local;
  
  local_1c = 0;
  pcStack_18 = src;
  src_local = dst;
  if (dst != (char *)0x0) {
    for (; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1) {
      *src_local = *pcStack_18;
      src_local = src_local + 1;
      local_1c = local_1c + 1;
    }
    *src_local = '\0';
  }
  return local_1c;
}

Assistant:

int TextCopy(char *dst, const char *src)
{
    int bytes = 0;

    if (dst != NULL)
    {
        while (*src != '\0')
        {
            *dst = *src;
            dst++;
            src++;

            bytes++;
        }

        *dst = '\0';
    }

    return bytes;
}